

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O2

void av1_dist_wtd_comp_weight_assign
               (AV1_COMMON *cm,MB_MODE_INFO *mbmi,int *fwd_offset,int *bck_offset,
               int *use_dist_wtd_comp_avg,int is_compound)

{
  uint uVar1;
  uint uVar2;
  RefCntBuffer *pRVar3;
  RefCntBuffer *pRVar4;
  int *piVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  OrderHintInfo *oh;
  
  if ((is_compound == 0) || ((mbmi->field_0xa8 & 2) != 0)) {
    *fwd_offset = 8;
    *bck_offset = 8;
    *use_dist_wtd_comp_avg = 0;
  }
  else {
    *use_dist_wtd_comp_avg = 1;
    pRVar3 = get_ref_frame_buf(cm,mbmi->ref_frame[0]);
    pRVar4 = get_ref_frame_buf(cm,mbmi->ref_frame[1]);
    uVar9 = 0;
    uVar7 = 0;
    if (pRVar3 != (RefCntBuffer *)0x0) {
      uVar7 = pRVar3->order_hint;
    }
    uVar2 = cm->cur_frame->order_hint;
    if (pRVar4 != (RefCntBuffer *)0x0) {
      uVar9 = pRVar4->order_hint;
    }
    oh = &cm->seq_params->order_hint_info;
    uVar1 = get_relative_dist(oh,uVar9,uVar2);
    uVar9 = -uVar1;
    if (0 < (int)uVar1) {
      uVar9 = uVar1;
    }
    if (0x1e < uVar9) {
      uVar9 = 0x1f;
    }
    uVar2 = get_relative_dist(oh,uVar2,uVar7);
    uVar7 = -uVar2;
    if (0 < (int)uVar2) {
      uVar7 = uVar2;
    }
    uVar12 = 0x1f;
    if (uVar7 < 0x1f) {
      uVar12 = uVar7;
    }
    uVar6 = (ulong)(uVar9 <= uVar7);
    if ((uVar1 == 0) || (uVar2 == 0)) {
      *fwd_offset = quant_dist_lookup_table[3][uVar6];
      piVar5 = quant_dist_lookup_table[3] + (uVar7 < uVar9);
    }
    else {
      for (lVar10 = 0; lVar10 != 0x18; lVar10 = lVar10 + 8) {
        iVar11 = *(int *)((long)quant_dist_weight[0] + (ulong)((uint)(uVar9 <= uVar7) * 4) + lVar10)
                 * uVar9;
        iVar8 = *(int *)((long)quant_dist_weight[0] + (ulong)(uVar7 < uVar9) * 4 + lVar10) * uVar12;
        if ((uVar7 < uVar9 && iVar11 < iVar8) || (uVar7 >= uVar9 && iVar8 < iVar11)) break;
      }
      *fwd_offset = *(int *)((long)quant_dist_lookup_table[0] + lVar10 + uVar6 * 4);
      piVar5 = (int *)((long)quant_dist_lookup_table[0] + lVar10 + (ulong)(uVar7 < uVar9) * 4);
    }
    *bck_offset = *piVar5;
  }
  return;
}

Assistant:

void av1_dist_wtd_comp_weight_assign(const AV1_COMMON *cm,
                                     const MB_MODE_INFO *mbmi, int *fwd_offset,
                                     int *bck_offset,
                                     int *use_dist_wtd_comp_avg,
                                     int is_compound) {
  assert(fwd_offset != NULL && bck_offset != NULL);
  if (!is_compound || mbmi->compound_idx) {
    *fwd_offset = 8;
    *bck_offset = 8;
    *use_dist_wtd_comp_avg = 0;
    return;
  }

  *use_dist_wtd_comp_avg = 1;
  const RefCntBuffer *const bck_buf = get_ref_frame_buf(cm, mbmi->ref_frame[0]);
  const RefCntBuffer *const fwd_buf = get_ref_frame_buf(cm, mbmi->ref_frame[1]);
  const int cur_frame_index = cm->cur_frame->order_hint;
  int bck_frame_index = 0, fwd_frame_index = 0;

  if (bck_buf != NULL) bck_frame_index = bck_buf->order_hint;
  if (fwd_buf != NULL) fwd_frame_index = fwd_buf->order_hint;

  int d0 = clamp(abs(get_relative_dist(&cm->seq_params->order_hint_info,
                                       fwd_frame_index, cur_frame_index)),
                 0, MAX_FRAME_DISTANCE);
  int d1 = clamp(abs(get_relative_dist(&cm->seq_params->order_hint_info,
                                       cur_frame_index, bck_frame_index)),
                 0, MAX_FRAME_DISTANCE);

  const int order = d0 <= d1;

  if (d0 == 0 || d1 == 0) {
    *fwd_offset = quant_dist_lookup_table[3][order];
    *bck_offset = quant_dist_lookup_table[3][1 - order];
    return;
  }

  int i;
  for (i = 0; i < 3; ++i) {
    int c0 = quant_dist_weight[i][order];
    int c1 = quant_dist_weight[i][!order];
    int d0_c0 = d0 * c0;
    int d1_c1 = d1 * c1;
    if ((d0 > d1 && d0_c0 < d1_c1) || (d0 <= d1 && d0_c0 > d1_c1)) break;
  }

  *fwd_offset = quant_dist_lookup_table[i][order];
  *bck_offset = quant_dist_lookup_table[i][1 - order];
}